

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O0

int TasGrid::RuleLocal::getLevel<(TasGrid::RuleLocal::erule)1>(int point)

{
  undefined4 local_14;
  undefined4 local_10;
  int point_local;
  
  if (point == 0) {
    local_10 = 0;
  }
  else {
    if (point == 1) {
      local_14 = 1;
    }
    else {
      local_14 = Maths::intlog2(point + -1);
      local_14 = local_14 + 1;
    }
    local_10 = local_14;
  }
  return local_10;
}

Assistant:

int getLevel(int point) {
        switch(effective_rule) {
            case erule::pwc: {
                int level = 0;
                while(point >= 1){ point /= 3; level += 1; }
                return level;
            }
            case erule::localp:
            case erule::semilocalp:
                return (point == 0) ? 0 : (point == 1) ? 1 : (Maths::intlog2(point - 1) + 1);
            case erule::localp0:
                return Maths::intlog2(point + 1);
            default: // case erule::localpb:
                return (point <= 1) ? 0 : (Maths::intlog2(point - 1) + 1);
        };
    }